

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticAnalyzer.cpp
# Opt level: O2

optional<VariableDefinition> * __thiscall
Scope::findLocally(optional<VariableDefinition> *__return_storage_ptr__,Scope *this,
                  string *variableName,bool considerPartiallyBound)

{
  iterator iVar1;
  undefined1 local_38 [8];
  VariableDefinition vd;
  
  iVar1 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VariableDefinition>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VariableDefinition>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(this->localScope)._M_h,variableName);
  if (iVar1.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VariableDefinition>,_true>
      ._M_cur == (__node_type *)0x0) {
    (__return_storage_ptr__->super__Optional_base<VariableDefinition,_false,_false>)._M_payload.
    super__Optional_payload<VariableDefinition,_true,_false,_false>.
    super__Optional_payload_base<VariableDefinition>._M_engaged = false;
  }
  else {
    VariableDefinition::VariableDefinition
              ((VariableDefinition *)local_38,
               (VariableDefinition *)
               ((long)iVar1.
                      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VariableDefinition>,_true>
                      ._M_cur + 0x28));
    if (((char)vd.token.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
         '\0') || (considerPartiallyBound)) {
      std::optional<VariableDefinition>::optional<VariableDefinition,_true>
                (__return_storage_ptr__,(VariableDefinition *)local_38);
    }
    else {
      (__return_storage_ptr__->super__Optional_base<VariableDefinition,_false,_false>)._M_payload.
      super__Optional_payload<VariableDefinition,_true,_false,_false>.
      super__Optional_payload_base<VariableDefinition>._M_engaged = false;
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&vd);
  }
  return __return_storage_ptr__;
}

Assistant:

std::optional<VariableDefinition> findLocally(const std::string & variableName, bool considerPartiallyBound) {

    auto find = this->localScope.find(variableName);

    if (find == this->localScope.end()) {
      return std::nullopt;
    }

    VariableDefinition vd = find->second;

    if (!vd.isFullyBound) {
      if (considerPartiallyBound) {
        return vd;
      }

      return std::nullopt;
    }

    return vd;
  }